

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,size_t nbSeq,uint maxCode,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  byte bVar1;
  uint uVar2;
  uint *source;
  uint *puVar3;
  uint in_ECX;
  uint *in_RDX;
  uint *in_RSI;
  int in_EDI;
  long in_R9;
  uint max;
  size_t cSymbolTypeSizeEstimateInBits;
  BYTE *ctEnd;
  BYTE *ctStart;
  BYTE *ctp;
  uint *countWksp;
  undefined4 in_stack_ffffffffffffff98;
  size_t sVar4;
  uint *ctable;
  ulong local_8;
  
  source = (uint *)((long)in_RSI + (long)in_RDX);
  sVar4 = 0;
  puVar3 = in_RSI;
  uVar2 = in_ECX;
  ctable = in_RSI;
  HIST_countFast_wksp(in_RSI,in_RSI,source,0,(void *)CONCAT44(in_ECX,in_stack_ffffffffffffff98),
                      0x32d85a);
  if (in_EDI == 0) {
    if ((uint)ctStart < in_ECX) {
      __assert_fail("max <= defaultMax",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5f3b,
                    "size_t ZSTD_estimateBlockSize_symbolType(symbolEncodingType_e, const BYTE *, size_t, unsigned int, const FSE_CTable *, const U8 *, const short *, U32, U32, void *, size_t)"
                   );
    }
    sVar4 = ZSTD_crossEntropyCost
                      ((short *)ctp,(uint)((ulong)puVar3 >> 0x20),in_RSI,
                       (uint)((ulong)source >> 0x20));
  }
  else if (in_EDI == 1) {
    sVar4 = 0;
  }
  else if ((in_EDI == 2) || (in_EDI == 3)) {
    sVar4 = ZSTD_fseBitCost(ctable,in_RDX,uVar2);
  }
  uVar2 = ZSTD_isError(0x32d8f3);
  if (uVar2 == 0) {
    for (; puVar3 < source; puVar3 = (uint *)((long)puVar3 + 1)) {
      if (in_R9 == 0) {
        bVar1 = (byte)*puVar3;
      }
      else {
        bVar1 = *(byte *)(in_R9 + (ulong)(byte)*puVar3);
      }
      sVar4 = bVar1 + sVar4;
    }
    local_8 = sVar4 >> 3;
  }
  else {
    local_8 = (long)in_RDX * 10;
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_estimateBlockSize_symbolType(symbolEncodingType_e type,
                    const BYTE* codeTable, size_t nbSeq, unsigned maxCode,
                    const FSE_CTable* fseCTable,
                    const U8* additionalBits,
                    short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                    void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        (void)defaultMax;
        cSymbolTypeSizeEstimateInBits = ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) {
        return nbSeq * 10;
    }
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits >> 3;
}